

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O2

int mdb_mutex_failed(MDB_env *env,mdb_mutexref_t mutex,int rc)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  
  if (rc == 0x82) {
    rc = 0;
    bVar2 = true;
    bVar4 = (mdb_mutexref_t)((long)&env->me_txns->mt1 + 8) == mutex;
    if ((!bVar4) &&
       ((env->me_txns->mt1).mtb.mtb_txnid =
             env->me_metas[env->me_metas[0]->mm_txnid < env->me_metas[1]->mm_txnid]->mm_txnid,
       env->me_txn != (MDB_txn *)0x0)) {
      pbVar1 = (byte *)((long)&env->me_flags + 3);
      *pbVar1 = *pbVar1 | 0x80;
      env->me_txn = (MDB_txn *)0x0;
      rc = -0x784b;
      bVar2 = false;
    }
    iVar3 = mdb_reader_check0(env,(uint)bVar4,(int *)0x0);
    if (iVar3 == 0) {
      iVar3 = pthread_mutex_consistent((pthread_mutex_t *)mutex);
    }
    if ((bVar2) && (rc = iVar3, iVar3 == 0)) {
      rc = 0;
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)mutex);
    }
  }
  return rc;
}

Assistant:

static int ESECT
mdb_mutex_failed(MDB_env *env, mdb_mutexref_t mutex, int rc)
{
	int rlocked, rc2;
	MDB_meta *meta;

	if (rc == MDB_OWNERDEAD) {
		/* We own the mutex. Clean up after dead previous owner. */
		rc = MDB_SUCCESS;
		rlocked = (mutex == env->me_rmutex);
		if (!rlocked) {
			/* Keep mti_txnid updated, otherwise next writer can
			 * overwrite data which latest meta page refers to.
			 */
			meta = mdb_env_pick_meta(env);
			env->me_txns->mti_txnid = meta->mm_txnid;
			/* env is hosed if the dead thread was ours */
			if (env->me_txn) {
				env->me_flags |= MDB_FATAL_ERROR;
				env->me_txn = NULL;
				rc = MDB_PANIC;
			}
		}
		DPRINTF(("%cmutex owner died, %s", (rlocked ? 'r' : 'w'),
			(rc ? "this process' env is hosed" : "recovering")));
		rc2 = mdb_reader_check0(env, rlocked, NULL);
		if (rc2 == 0)
			rc2 = mdb_mutex_consistent(mutex);
		if (rc || (rc = rc2)) {
			DPRINTF(("LOCK_MUTEX recovery failed, %s", mdb_strerror(rc)));
			UNLOCK_MUTEX(mutex);
		}
	} else {
#ifdef _WIN32
		rc = ErrCode();
#endif
		DPRINTF(("LOCK_MUTEX failed, %s", mdb_strerror(rc)));
	}

	return rc;
}